

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcurrentSelector.hpp
# Opt level: O1

Status __thiscall
AO::BehaviorTree::Version_1::Details::ConcurrentSelector<Agent,_short>::execute
          (ConcurrentSelector<Agent,_short> *this,EntityPtr entity,short args)

{
  ChildrenStatusMap *this_00;
  char cVar1;
  pointer psVar2;
  element_type *peVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  mapped_type *pmVar7;
  Status SVar8;
  bool bVar9;
  mapped_type mVar10;
  bool bVar11;
  pointer __k;
  __node_base *p_Var12;
  bool bVar13;
  
  if ((this->childrenStatus)._M_h._M_element_count == 0) {
    initialize(this,entity);
  }
  __k = (this->super_CompositeNode<Agent,_short>).children.
        super__Vector_base<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_std::allocator<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (this->super_CompositeNode<Agent,_short>).children.
           super__Vector_base<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_std::allocator<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar13 = __k == psVar2;
  if (!bVar13) {
    this_00 = &this->childrenStatus;
    do {
      pmVar7 = std::__detail::
               _Map_base<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>,_std::allocator<std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>_>,_std::__detail::_Select1st,_std::equal_to<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::hash<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>,_std::allocator<std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>_>,_std::__detail::_Select1st,_std::equal_to<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::hash<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,__k);
      if (*pmVar7 == Running) {
        peVar3 = (__k->
                 super___shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        uVar5 = (*(peVar3->super_RootNode<Agent,_short>)._vptr_RootNode[3])
                          (peVar3,entity,(ulong)(uint)(int)args);
        mVar10 = (mapped_type)uVar5;
        if (mVar10 != Success) {
          if ((uVar5 & 0xff) != 1) goto LAB_0011be86;
          mVar10 = Failure;
          if (this->failPolicy == FailOnOne) {
            initialize(this,entity);
            if (!bVar13) {
              return Failure;
            }
            break;
          }
        }
        pmVar7 = std::__detail::
                 _Map_base<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>,_std::allocator<std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>_>,_std::__detail::_Select1st,_std::equal_to<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::hash<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>,_std::allocator<std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>_>,_std::__detail::_Select1st,_std::equal_to<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::hash<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)this_00,__k);
        *pmVar7 = mVar10;
      }
LAB_0011be86:
      pmVar7 = std::__detail::
               _Map_base<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>,_std::allocator<std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>_>,_std::__detail::_Select1st,_std::equal_to<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::hash<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>,_std::allocator<std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>_>,_std::__detail::_Select1st,_std::equal_to<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::hash<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,__k);
      if ((*pmVar7 == Failure) && (this->failPolicy == FailOnAll)) {
        peVar3 = (__k->
                 super___shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        iVar6 = (*(peVar3->super_RootNode<Agent,_short>)._vptr_RootNode[3])
                          (peVar3,entity,(ulong)(uint)(int)args);
        pmVar7 = std::__detail::
                 _Map_base<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>,_std::allocator<std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>_>,_std::__detail::_Select1st,_std::equal_to<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::hash<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>,_std::allocator<std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>_>,_std::__detail::_Select1st,_std::equal_to<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::hash<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)this_00,__k);
        *pmVar7 = (mapped_type)iVar6;
      }
      __k = __k + 1;
      bVar13 = __k == psVar2;
    } while (!bVar13);
  }
  p_Var12 = &(this->childrenStatus)._M_h._M_before_begin;
  bVar11 = true;
  bVar13 = false;
  bVar9 = true;
  SVar8 = Failure;
  do {
    p_Var12 = p_Var12->_M_nxt;
    if (p_Var12 == (__node_base *)0x0) break;
    cVar1 = (char)*(size_t *)(p_Var12 + 3);
    bVar4 = true;
    if (cVar1 == '\x02') {
      if ((this->failPolicy == FailOnAll) && (this->succeedPolicy == SuccessOnAll)) {
        bVar4 = false;
        SVar8 = Running;
      }
      else {
        bVar11 = false;
LAB_0011bf56:
        bVar9 = false;
      }
    }
    else if (cVar1 == '\x01') {
      if (this->failPolicy != FailOnOne) goto LAB_0011bf56;
      initialize(this,entity);
      SVar8 = Failure;
      bVar4 = false;
    }
    else if (cVar1 == '\0') {
      bVar4 = true;
      if ((this->succeedPolicy == SuccessOnOne) && (this->failPolicy != FailOnOne)) {
        initialize(this,entity);
        bVar4 = false;
        SVar8 = Success;
      }
      else {
        bVar13 = true;
        bVar11 = false;
      }
    }
  } while (bVar4);
  if (p_Var12 != (__node_base *)0x0) {
    return SVar8;
  }
  if ((this->failPolicy != FailOnAll) || (SVar8 = Failure, !bVar11)) {
    if (this->succeedPolicy == SuccessOnOne) {
      if (!bVar13) {
        return Running;
      }
      SVar8 = Success;
    }
    else {
      if (this->succeedPolicy != SuccessOnAll) {
        return Running;
      }
      if (!bVar9) {
        return Running;
      }
      SVar8 = Success;
    }
  }
  initialize(this,entity);
  return SVar8;
}

Assistant:

Status execute(EntityPtr entity, Args... args) override final
					{
						if (childrenStatus.empty())
						{
							initialize(entity);
						}
						for (auto &child : this->children)
						{
							if (childrenStatus[child] == Status::Running)
							{
								Status const status = child->execute(entity, args...);
								if (status == Status::Failure)
								{
									if (failPolicy == FailurePolicy::FailOnOne)
									{
										initialize(entity);
										return Status::Failure;
									}
									else
									{
										childrenStatus[child] = Status::Failure;
									}
								}
								else if (status == Status::Success)
								{
									childrenStatus[child] = Status::Success;
								}
							}
							if (childrenStatus[child] == Status::Failure && failPolicy == FailurePolicy::FailOnAll)
							{
								childrenStatus[child] = child->execute(entity, args...);
							}
						}
						bool sawSuccess = false;
						bool sawAllFails = true;
						bool sawAllSuccess = true;
						for (auto &pair : childrenStatus)
						{
							switch (pair.second)
							{
							case Status::Success:
								if (succeedPolicy == SuccessPolicy::SuccessOnOne && failPolicy != FailurePolicy::FailOnOne)
								{
									initialize(entity);
									return Status::Success;
								}
								else
								{
									sawSuccess = true;
									sawAllFails = false;
								}
								break;
							case Status::Failure:
								if (failPolicy == FailurePolicy::FailOnOne)
								{
									initialize(entity);
									return Status::Failure;
								}
								else
								{
									sawAllSuccess = false;
								}
								break;
							case Status::Running:
								if (failPolicy == FailurePolicy::FailOnAll && succeedPolicy == SuccessPolicy::SuccessOnAll)
								{
									return Status::Running;
								}
								sawAllFails = false;
								sawAllSuccess = false;
								break;
							default:
								break;
							}
						}
						if (failPolicy == FailurePolicy::FailOnAll && sawAllFails)
						{
							initialize(entity);
							return Status::Failure;
						}
						else if ((succeedPolicy == SuccessPolicy::SuccessOnAll && sawAllSuccess) || (succeedPolicy == SuccessPolicy::SuccessOnOne && sawSuccess))
						{
							initialize(entity);
							return Status::Success;
						}
						else
						{
							return Status::Running;
						}
					}